

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void gai_oper_elem(Integer g_a,Integer *lo,Integer *hi,void *scalar,Integer op)

{
  int iVar1;
  int iVar2;
  logical lVar3;
  Integer *in_RDX;
  Integer *in_RSI;
  Integer in_RDI;
  Integer nproc;
  Integer loS [7];
  Integer chk;
  Integer jtmp;
  Integer j;
  Integer i;
  Integer offset;
  _iterator_hdl hdl;
  int local_sync_end;
  int local_sync_begin;
  Integer num_blocks;
  Integer me;
  char *data_ptr;
  Integer ld [7];
  Integer hiA [7];
  Integer loA [7];
  Integer type;
  Integer dims [7];
  Integer ndim;
  Integer aIStackY_4a8 [4];
  Integer *in_stack_fffffffffffffb78;
  char **in_stack_fffffffffffffb80;
  Integer *in_stack_fffffffffffffb88;
  Integer *in_stack_fffffffffffffb90;
  _iterator_hdl *in_stack_fffffffffffffb98;
  long local_460;
  _iterator_hdl *in_stack_fffffffffffffc08;
  Integer in_stack_fffffffffffffc10;
  void *in_stack_fffffffffffffc28;
  Integer *in_stack_fffffffffffffc30;
  Integer *in_stack_fffffffffffffc38;
  Integer *in_stack_fffffffffffffc40;
  Integer in_stack_fffffffffffffc48;
  Integer in_stack_fffffffffffffc50;
  void *in_stack_fffffffffffffc60;
  Integer in_stack_fffffffffffffc68;
  Integer in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  char *in_stack_fffffffffffffd38;
  Integer in_stack_fffffffffffffd40;
  Integer *in_stack_fffffffffffffd48;
  Integer *in_stack_fffffffffffffd50;
  Integer *in_stack_fffffffffffffd58;
  Integer in_stack_fffffffffffffd60;
  long local_128 [8];
  Integer local_e8 [8];
  Integer local_a8 [7];
  undefined8 local_70;
  long local_30;
  Integer *local_18;
  Integer *local_10;
  Integer local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pnga_nodeid();
  iVar1 = _ga_sync_end;
  iVar2 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar2 != 0) {
    pnga_sync();
  }
  pnga_check_handle(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  pnga_inquire(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
  pnga_total_blocks(local_8);
  pnga_local_iterator_init(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  do {
    do {
      iVar2 = pnga_local_iterator_next
                        (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                         in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                         in_stack_fffffffffffffb78);
      if (iVar2 == 0) {
        if (iVar1 != 0) {
          pnga_sync();
        }
        return;
      }
      pnga_nnodes();
      for (local_460 = 0; local_460 < local_30; local_460 = local_460 + 1) {
        aIStackY_4a8[local_460] = local_a8[local_460];
      }
      lVar3 = pnga_patch_intersect(local_10,local_18,local_a8,local_e8,local_30);
    } while (lVar3 == 0);
    in_stack_fffffffffffffb90 = (Integer *)0x1;
    for (local_460 = 0; local_460 < local_30; local_460 = local_460 + 1) {
      if (aIStackY_4a8[local_460] < local_a8[local_460]) {
        in_stack_fffffffffffffb90 = (Integer *)0x0;
        break;
      }
    }
    if (in_stack_fffffffffffffb90 == (Integer *)0x0) {
      in_stack_fffffffffffffb98 = (_iterator_hdl *)0x1;
      for (local_460 = 0; local_460 < local_30 + -1; local_460 = local_460 + 1) {
        in_stack_fffffffffffffb98 =
             (_iterator_hdl *)(local_128[local_460] * (long)in_stack_fffffffffffffb98);
      }
      switch(local_70) {
      case 0x3e9:
        break;
      case 0x3ea:
        break;
      case 0x3eb:
        break;
      case 0x3ec:
        break;
      default:
        pnga_error(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        break;
      case 0x3ee:
        break;
      case 0x3ef:
      }
    }
    ngai_do_oper_elem(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                      in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                      in_stack_fffffffffffffc60,in_stack_fffffffffffffc68);
  } while( true );
}

Assistant:

static void gai_oper_elem(Integer g_a, Integer *lo, Integer *hi, void *scalar, Integer op)
{

  Integer ndim, dims[MAXDIM], type;
  Integer loA[MAXDIM], hiA[MAXDIM], ld[MAXDIM];
  char *data_ptr;
  Integer me= pnga_nodeid();
  Integer num_blocks;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle(g_a, "gai_oper_elem");


  pnga_inquire(g_a,  &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);

  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&data_ptr,ld)) {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }
    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){
      /* Check for partial overlap */
      chk = 1;
      for (j=0; j<ndim; j++) {
        if (loS[j] < loA[j]) {
          chk=0;
          break;
        }
      }
      if (!chk) {
        /* Evaluate additional offset for pointer */
        offset = 0;
        jtmp = 1;
        for (j=0; j<ndim-1; j++) {
          offset += (loA[j]-loS[j])*jtmp;
          jtmp *= ld[j];
        }
        offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
        switch (type){
          case C_INT:
            data_ptr = (void*)((int*)data_ptr + offset);
            break;
          case C_DCPL:
            data_ptr = (void*)((double*)data_ptr + 2*offset);
            break;
          case C_SCPL:
            data_ptr = (void*)((float*)data_ptr + 2*offset);
            break;
          case C_DBL:
            data_ptr = (void*)((double*)data_ptr + offset);
            break;
          case C_FLOAT:
            data_ptr = (void*)((float*)data_ptr + offset);
            break;
          case C_LONG:
            data_ptr = (void*)((long*)data_ptr + offset);
            break;
          default: pnga_error(" wrong data type ",type);
        }
      }
      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);
    }
  }
#if 0
  if (num_blocks < 0) {
    /* get limits of VISIBLE patch */
    pnga_distribution(g_a, me, loA, hiA);

    /* loA is changed by pnga_patch_intersect, so
       save a copy */
    for (j=0; j<ndim; j++) {
      loS[j] = loA[j];
    }

    /*  determine subset of my local patch to access  */
    /*  Output is in loA and hiA */
    if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

      /* get data_ptr to corner of patch */
      /* ld are leading dimensions INCLUDING ghost cells */
      pnga_access_ptr(g_a, loA, hiA, &data_ptr, ld);

      /* perform operation on all elements in local patch */
      ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

      /* release access to the data */
      pnga_release_update(g_a, loA, hiA);
    }
  } else {
    Integer offset, i, j, jtmp, chk;
    Integer loS[MAXDIM];
    Integer nproc = pnga_nnodes();
    /* using simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)){
      for (i=me; i<num_blocks; i += nproc) {

        /* get limits of patch */
        pnga_distribution(g_a, i, loA, hiA); 

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_ptr(g_a, i, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }
          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block(g_a, i);
        }
      }
    } else {
      /* using scalapack block-cyclic data distribution */
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[ndim-1] < blocks[ndim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < ndim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > dims[i]) hiA[i] = dims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }

        /* loA is changed by pnga_patch_intersect, so
           save a copy */
        for (j=0; j<ndim; j++) {
          loS[j] = loA[j];
        }

        /*  determine subset of my local patch to access  */
        /*  Output is in loA and hiA */
        if(pnga_patch_intersect(lo, hi, loA, hiA, ndim)){

          /* get data_ptr to corner of patch */
          /* ld are leading dimensions for block */
          pnga_access_block_grid_ptr(g_a, index, &data_ptr, ld);

          /* Check for partial overlap */
          chk = 1;
          for (j=0; j<ndim; j++) {
            if (loS[j] < loA[j]) {
              chk=0;
              break;
            }
          }
          if (!chk) {
            /* Evaluate additional offset for pointer */
            offset = 0;
            jtmp = 1;
            for (j=0; j<ndim-1; j++) {
              offset += (loA[j]-loS[j])*jtmp;
              jtmp *= ld[j];
            }
            offset += (loA[ndim-1]-loS[ndim-1])*jtmp;
            switch (type){
              case C_INT:
                data_ptr = (void*)((int*)data_ptr + offset);
                break;
              case C_DCPL:
                data_ptr = (void*)((double*)data_ptr + 2*offset);
                break;
              case C_SCPL:
                data_ptr = (void*)((float*)data_ptr + 2*offset);
                break;
              case C_DBL:
                data_ptr = (void*)((double*)data_ptr + offset);
                break;
              case C_FLOAT:
                data_ptr = (void*)((float*)data_ptr + offset);
                break;
              case C_LONG:
                data_ptr = (void*)((long*)data_ptr + offset);
                break;
              default: pnga_error(" wrong data type ",type);
            }
          }

          /* perform operation on all elements in local patch */
          ngai_do_oper_elem(type, ndim, loA, hiA, ld, data_ptr, scalar, op);

          /* release access to the data */
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < ndim; i++) {
          if (index[i] >= blocks[i] && i<ndim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}